

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_nlzc_d_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws)

{
  bool bVar1;
  ulong uVar2;
  float64 fVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  fVar3 = (env->active_fpu).fpr[ws].fd;
  iVar5 = 0x40;
  uVar6 = 0x20;
  do {
    uVar4 = fVar3 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar4 == 0) {
      uVar7 = 0;
      uVar4 = fVar3;
    }
    fVar3 = uVar4;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  (env->active_fpu).fpr[wd].fd = (long)iVar5 - fVar3;
  uVar4 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  iVar5 = 0x40;
  uVar6 = 0x20;
  do {
    uVar2 = uVar4 >> (sbyte)uVar6;
    uVar7 = uVar6;
    if (uVar2 == 0) {
      uVar7 = 0;
      uVar2 = uVar4;
    }
    uVar4 = uVar2;
    iVar5 = iVar5 - uVar7;
    bVar1 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar1);
  *(ulong *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = (long)iVar5 - uVar4;
  return;
}

Assistant:

void helper_msa_nlzc_d(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->d[0]  = msa_nlzc_df(DF_DOUBLE, pws->d[0]);
    pwd->d[1]  = msa_nlzc_df(DF_DOUBLE, pws->d[1]);
}